

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hasha.c
# Opt level: O0

void test_hash_empty(void)

{
  uint8_t auVar1 [32];
  uint8_t auVar2 [32];
  byte bVar3;
  unsigned_long_long atto_idx_1;
  _Bool is_tag_valid;
  unsigned_long_long atto_idx;
  ascon_hash_ctx_t hash_ctx;
  uint8_t obtained_digest [32];
  vecs_hash_t testcase;
  ulong local_4b0;
  ulong local_4a0;
  char local_498 [64];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_440;
  vecs_hash_t local_430;
  
  memcpy(&local_430,&DAT_0012dfe8,0x430);
  local_458 = 0x2a;
  uStack_450 = 0;
  uStack_448 = 0;
  uStack_440 = 0;
  ascon_hash_init(local_498);
  if (local_498[0x38] == '\0') {
    ascon_hash_final(local_498,&local_458);
    vecs_hash_log(&local_430,(uint8_t *)&local_458);
    auVar1[8] = (undefined1)uStack_450;
    auVar1[9] = uStack_450._1_1_;
    auVar1[10] = uStack_450._2_1_;
    auVar1[0xb] = uStack_450._3_1_;
    auVar1[0xc] = uStack_450._4_1_;
    auVar1[0xd] = uStack_450._5_1_;
    auVar1[0xe] = uStack_450._6_1_;
    auVar1[0xf] = uStack_450._7_1_;
    auVar1[0] = (undefined1)local_458;
    auVar1[1] = local_458._1_1_;
    auVar1[2] = local_458._2_1_;
    auVar1[3] = local_458._3_1_;
    auVar1[4] = local_458._4_1_;
    auVar1[5] = local_458._5_1_;
    auVar1[6] = local_458._6_1_;
    auVar1[7] = local_458._7_1_;
    auVar1[0x10] = (undefined1)uStack_448;
    auVar1[0x11] = uStack_448._1_1_;
    auVar1[0x12] = uStack_448._2_1_;
    auVar1[0x13] = uStack_448._3_1_;
    auVar1[0x14] = uStack_448._4_1_;
    auVar1[0x15] = uStack_448._5_1_;
    auVar1[0x16] = uStack_448._6_1_;
    auVar1[0x17] = uStack_448._7_1_;
    auVar1[0x18] = (undefined1)uStack_440;
    auVar1[0x19] = uStack_440._1_1_;
    auVar1[0x1a] = uStack_440._2_1_;
    auVar1[0x1b] = uStack_440._3_1_;
    auVar1[0x1c] = uStack_440._4_1_;
    auVar1[0x1d] = uStack_440._5_1_;
    auVar1[0x1e] = uStack_440._6_1_;
    auVar1[0x1f] = uStack_440._7_1_;
    if (auVar1 == local_430.expected_digest) {
      ascon_hash_init(local_498);
      ascon_hash_update(local_498,0);
      ascon_hash_update(local_498,&local_458,0);
      ascon_hash_update(local_498,0);
      ascon_hash_final(local_498,&local_458);
      vecs_hash_log(&local_430,(uint8_t *)&local_458);
      auVar2[8] = (undefined1)uStack_450;
      auVar2[9] = uStack_450._1_1_;
      auVar2[10] = uStack_450._2_1_;
      auVar2[0xb] = uStack_450._3_1_;
      auVar2[0xc] = uStack_450._4_1_;
      auVar2[0xd] = uStack_450._5_1_;
      auVar2[0xe] = uStack_450._6_1_;
      auVar2[0xf] = uStack_450._7_1_;
      auVar2[0] = (undefined1)local_458;
      auVar2[1] = local_458._1_1_;
      auVar2[2] = local_458._2_1_;
      auVar2[3] = local_458._3_1_;
      auVar2[4] = local_458._4_1_;
      auVar2[5] = local_458._5_1_;
      auVar2[6] = local_458._6_1_;
      auVar2[7] = local_458._7_1_;
      auVar2[0x10] = (undefined1)uStack_448;
      auVar2[0x11] = uStack_448._1_1_;
      auVar2[0x12] = uStack_448._2_1_;
      auVar2[0x13] = uStack_448._3_1_;
      auVar2[0x14] = uStack_448._4_1_;
      auVar2[0x15] = uStack_448._5_1_;
      auVar2[0x16] = uStack_448._6_1_;
      auVar2[0x17] = uStack_448._7_1_;
      auVar2[0x18] = (undefined1)uStack_440;
      auVar2[0x19] = uStack_440._1_1_;
      auVar2[0x1a] = uStack_440._2_1_;
      auVar2[0x1b] = uStack_440._3_1_;
      auVar2[0x1c] = uStack_440._4_1_;
      auVar2[0x1d] = uStack_440._5_1_;
      auVar2[0x1e] = uStack_440._6_1_;
      auVar2[0x1f] = uStack_440._7_1_;
      if (auVar2 == local_430.expected_digest) {
        for (local_4a0 = 0; local_4a0 < 0x40; local_4a0 = local_4a0 + 1) {
          if (local_498[local_4a0] != '\0') {
            printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                   ,0x3e,"test_hash_empty",atto_counter);
            atto_at_least_one_fail = '\x01';
            return;
          }
        }
        ascon_hash_init(local_498);
        bVar3 = ascon_hash_final_matches(local_498,local_430.expected_digest);
        if ((bVar3 & 1) == 1) {
          for (local_4b0 = 0; local_4b0 < 0x40; local_4b0 = local_4b0 + 1) {
            if (local_498[local_4b0] != '\0') {
              printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                     ,0x44,"test_hash_empty",atto_counter);
              atto_at_least_one_fail = '\x01';
              return;
            }
          }
        }
        else {
          printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
                 ,0x43,"test_hash_empty",atto_counter);
          atto_at_least_one_fail = '\x01';
        }
      }
      else {
        printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
               ,0x3d,"test_hash_empty",atto_counter);
        atto_at_least_one_fail = '\x01';
      }
    }
    else {
      printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
             ,0x31,"test_hash_empty",atto_counter);
      atto_at_least_one_fail = '\x01';
    }
  }
  else {
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_hash.c"
           ,0x2b,"test_hash_empty",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

static void test_hash_empty(void)
{
    vecs_hash_t testcase =
            {
                    .message_len = 0,
                    .message = {0},
                    .expected_digest = {
                            0xAE, 0xCD, 0x02, 0x70, 0x26, 0xD0, 0x67, 0x5F,
                            0x9D, 0xE7, 0xA8, 0xAD, 0x8C, 0xCF, 0x51, 0x2D,
                            0xB6, 0x4B, 0x1E, 0xDC, 0xF0, 0xB2, 0x0C, 0x38,
                            0x8A, 0x0C, 0x7C, 0xC6, 0x17, 0xAA, 0xA2, 0xC4
                    }
            };
    uint8_t obtained_digest[ASCON_HASHA_DIGEST_LEN] = {42};
    ascon_hash_ctx_t hash_ctx;

    // Without update call
    ascon_hasha_init(&hash_ctx);
    atto_eq(hash_ctx.buffer_len, 0);
    ascon_hasha_final(&hash_ctx, obtained_digest);

    vecs_hash_log(&testcase, obtained_digest);
    atto_memeq(obtained_digest,
               testcase.expected_digest,
               ASCON_HASHA_DIGEST_LEN);

    // With update calls of zero length
    ascon_hasha_init(&hash_ctx);
    ascon_hasha_update(&hash_ctx, NULL, 0);
    ascon_hasha_update(&hash_ctx, obtained_digest, 0);
    ascon_hasha_update(&hash_ctx, NULL, 0);
    ascon_hasha_final(&hash_ctx, obtained_digest);

    vecs_hash_log(&testcase, obtained_digest);
    atto_memeq(obtained_digest,
               testcase.expected_digest,
               ASCON_HASHA_DIGEST_LEN);
    atto_zeros(&hash_ctx, sizeof(hash_ctx));

    // With the final_matches validation
    ascon_hasha_init(&hash_ctx);
    bool is_tag_valid = ascon_hasha_final_matches(&hash_ctx, testcase.expected_digest);
    atto_eq(is_tag_valid, ASCON_TAG_OK);
    atto_zeros(&hash_ctx, sizeof(ascon_hash_ctx_t));
}